

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psftp.c
# Opt level: O3

_Bool sftp_action_chmod(void *vctx,char *fname)

{
  uint uVar1;
  fxp_attrs attrs;
  _Bool _Var2;
  sftp_request *psVar3;
  sftp_packet *psVar4;
  char *pcVar5;
  char *__format;
  uint uVar6;
  fxp_attrs local_60;
  
  psVar3 = fxp_stat_send(fname);
  psVar4 = sftp_wait_for_reply(psVar3);
  _Var2 = fxp_stat_recv(psVar4,psVar3,&local_60);
  if (_Var2) {
    if ((local_60.flags & 4) != 0) {
      local_60.flags = 4;
      uVar6 = (uint)local_60.permissions & 0xfff;
      uVar1 = *(uint *)((long)vctx + 4) ^ ~*vctx & (uint)local_60.permissions;
      local_60.permissions = (unsigned_long)uVar1;
      if (uVar6 == (uVar1 & 0xfff)) {
        return true;
      }
      attrs.size = local_60.size;
      attrs.flags = 4;
      attrs.uid = local_60.uid;
      attrs.gid = local_60.gid;
      attrs.permissions._0_4_ = uVar1;
      attrs.permissions._4_4_ = 0;
      attrs.atime = local_60.atime;
      attrs.mtime = local_60.mtime;
      psVar3 = fxp_setstat_send(fname,attrs);
      psVar4 = sftp_wait_for_reply(psVar3);
      _Var2 = fxp_setstat_recv(psVar4,psVar3);
      if (_Var2) {
        printf("%s: %04o -> %04o\n",fname,(ulong)uVar6,(ulong)(uVar1 & 0xfff));
        return true;
      }
      pcVar5 = fxp_error();
      __format = "set attrs for %s: %s\n";
      goto LAB_00111b54;
    }
    pcVar5 = "file permissions not provided";
  }
  else {
    pcVar5 = fxp_error();
  }
  __format = "get attrs for %s: %s\n";
LAB_00111b54:
  printf(__format,fname,pcVar5);
  return false;
}

Assistant:

static bool sftp_action_chmod(void *vctx, char *fname)
{
    struct fxp_attrs attrs;
    struct sftp_packet *pktin;
    struct sftp_request *req;
    bool result;
    unsigned oldperms, newperms;
    struct sftp_context_chmod *ctx = (struct sftp_context_chmod *)vctx;

    req = fxp_stat_send(fname);
    pktin = sftp_wait_for_reply(req);
    result = fxp_stat_recv(pktin, req, &attrs);

    if (!result || !(attrs.flags & SSH_FILEXFER_ATTR_PERMISSIONS)) {
        printf("get attrs for %s: %s\n", fname,
               result ? "file permissions not provided" : fxp_error());
        return false;
    }

    attrs.flags = SSH_FILEXFER_ATTR_PERMISSIONS;   /* perms _only_ */
    oldperms = attrs.permissions & 07777;
    attrs.permissions &= ~ctx->attrs_clr;
    attrs.permissions ^= ctx->attrs_xor;
    newperms = attrs.permissions & 07777;

    if (oldperms == newperms)
        return true;                   /* no need to do anything! */

    req = fxp_setstat_send(fname, attrs);
    pktin = sftp_wait_for_reply(req);
    result = fxp_setstat_recv(pktin, req);

    if (!result) {
        printf("set attrs for %s: %s\n", fname, fxp_error());
        return false;
    }

    printf("%s: %04o -> %04o\n", fname, oldperms, newperms);

    return true;
}